

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botStruct.hh
# Opt level: O1

sptr<const_std::string> __thiscall discordpp::BotStruct::Call::get_target_abi_cxx11_(Call *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long *in_RSI;
  sptr<const_std::string> sVar4;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  if ((_func_int **)in_RSI[10] == (_func_int **)0x0) {
    (**(code **)(*in_RSI + 0x18))(&local_38);
    p_Var3 = p_Stack_30;
    lVar2 = local_38;
    local_38 = 0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[0xb];
    in_RSI[10] = lVar2;
    in_RSI[0xb] = (long)p_Var3;
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
    }
    this->_vptr_Call = (_func_int **)in_RSI[10];
    peVar1 = (element_type *)in_RSI[0xb];
    (this->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
    super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    if (peVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
                 super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>).
                      _M_weak_this.
                      super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
                 super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>).
                      _M_weak_this.
                      super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      in_RDX._M_pi = extraout_RDX_01;
    }
  }
  else {
    this->_vptr_Call = (_func_int **)in_RSI[10];
    peVar1 = (element_type *)in_RSI[0xb];
    (this->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
    super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    if (peVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
                 super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>).
                      _M_weak_this.
                      super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
                 super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar1->super_enable_shared_from_this<discordpp::BotStruct::Call>).
                      _M_weak_this.
                      super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
  }
  sVar4.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (sptr<const_std::string>)
         sVar4.
         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

NEW_BASIC_RENDERABLE_FIELD(std::string, method, )
    NEW_BASIC_RENDERABLE_FIELD(std::string, target, )
    NEW_BASIC_RENDERABLE_FIELD(std::string, type, )
    NEW_BASIC_RENDERABLE_FIELD(std::string, body, )
    NEW_BASIC_RENDERABLE_FIELD(handleWrite, onWrite, )
    NEW_BASIC_RENDERABLE_FIELD(handleRead, onRead, )
#include "macros/defineCallClose.hh"

#define Parent Call
#define Class JsonCall
#define function callJson
#include "macros/defineCallOpen.hh"
    NEW_RENDERABLE_FIELD(json, payload, USEDBY(body))
    FORWARD_FIELD(std::string, method, )
    FORWARD_FIELD(std::string, target, )
    STATIC_FIELD(std::string, type, "application/json")
    HIDE_FIELD(body)
    FORWARD_FIELD(handleWrite, onWrite, )
    FORWARD_FIELD(handleRead, onRead, )

  protected:
    virtual sptr<const json> render_payload() {
        return std::make_shared<const json>(*_payload);
    }
    sptr<const std::string> render_body() override {
        return std::make_shared<const std::string>(get_payload()->dump());
    }
#include "macros/defineCallClose.hh"

#define Parent JsonCall
#define Class FileCall
#define function callFile
#include "macros/defineCallOpen.hh"
    NEW_BASIC_RENDERABLE_FIELD(std::string, filename, USEDBY(body))
    NEW_BASIC_RENDERABLE_FIELD(std::string, filetype, USEDBY(body))
    NEW_FIELD(std::string, file, USEDBY(body, boundary))
    FORWARD_FIELD(json, payload, USEDBY(boundary))
    FORWARD_FIELD(std::string, method, )
    FORWARD_FIELD(std::string, target, )
    FORWARD_FIELD(handleWrite, onWrite, )
    FORWARD_FIELD(handleRead, onRead, )

  protected:
    sptr<const std::string> render_type() override {
        return std::make_shared<const std::string>(
            "multipart/form-data; boundary=" + *render_boundary());
    }

  protected:
    sptr<const std::string> _rendered_boundary = nullptr;
    sptr<const std::string> render_boundary() {
        return _rendered_boundary
                   ? _rendered_boundary
                   : _rendered_boundary = std::make_shared<const std::string>(
                         util::generate_boundary(
                             get_payload() ? get_payload()->dump() : "",
                             _file));
    }

    sptr<const std::string> render_body() override {
        auto boundary = render_boundary();
        auto body = std::make_shared<std::string>("--");
        *body += *boundary;
        if (get_payload()) {
            *body += "\r\nContent-Disposition: form-data; name=\"payload_json\""
                     "\r\nContent-Type: application/json\r\n\r\n";
            *body += get_payload()->dump();
            *body += "\r\n--";
            *body += *boundary;
        }
        if (_file) {
            *body += "\r\nContent-Disposition: form-data; name=\"file\"; "
                     "filename=\"";
            *body += *_filename;
            *body += "\"\r\nContent-Type: ";
            *body += *_filetype;
            *body += "\r\n\r\n";
            *body += *_file;
            *body += "\r\n--";
            *body += *boundary;
        }
        *body += "--";
        return std::const_pointer_cast<const std::string>(body);
    }

    void clear_boundary() {
        _rendered_boundary = nullptr;
        clear_type();
        clear_body();
    }
#include "macros/defineCallClose.hh"

#undef Bot

#define FIELDS                                                                 \
    FIELD(std::string, method)                                                 \
    SEPARATOR                                                                  \
    FIELD(std::string, target)                                                 \
    SEPARATOR                                                                  \
    FIELD(std::string, type)                                                   \
    SEPARATOR                                                                  \
    FIELD(std::string, body)                                                   \
    SEPARATOR                                                                  \
    FIELD(handleWrite, onWrite)                                                \
    SEPARATOR                                                                  \
    FIELD(handleRead, onRead)

    class RenderedCall {
      public:
#define FIELD(type, name) name(src->get_##name())
#define SEPARATOR ,
        explicit RenderedCall(Call *src) : FIELDS {}
#undef SEPARATOR
#undef FIELD

#define SEPARATOR ,
#define FIELD(type, name) const sptr<const type> &name
        explicit RenderedCall(FIELDS)
#undef FIELD
#define FIELD(type, name) name(name)
            : FIELDS {
        }
#undef FIELD
#undef SEPARATOR

#define FIELD(type, name) const sptr<const type> name;
#define SEPARATOR
        FIELDS
#undef SEPARATOR
#undef FIELD
    };

#undef FIELDS

    virtual void send(const int opcode, sptr<const json> payload,
                      sptr<const handleSent> callback) = 0;

    void run() {
        for (const auto &module : needInit) {
            if (module.second) {
                log::log(log::error, [module](std::ostream *log) {
                    *log << "Forgot to initialize: " << module.first << '\n';
                });
                exit(1);
            }
        }
        runctd();
    }

  protected:
    virtual void runctd() {
        log::log(log::error, [](std::ostream *log) {
            *log << "Starting run loop" << '\n';
        });
        work = std::make_unique<asio::executor_work_guard<
            asio::io_context::executor_type>>(
            asio::make_work_guard(*aioc));
        aioc->run();
        log::log(log::error,
                 [](std::ostream *log) { *log << "Ending run loop" << '\n'; });
    }

    virtual void connect() = 0;
    virtual void disconnect() {
        connected_ = false;
        ready_ = false;
    };
    virtual void reconnect(const std::string &reason,
                           const bool resume = true) = 0;